

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::wordModifiers(string *unit)

{
  ulong __n1;
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_type sVar7;
  long lVar8;
  byte bVar9;
  size_type __pos;
  bool bVar10;
  bool bVar11;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar9 = 0;
  iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,3,
                  "cup");
  if (iVar3 == 0) goto LAB_003b4109;
  bVar9 = 0;
  iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,0xd,
                  "hundredweight");
  if (iVar3 == 0) goto LAB_003b4109;
  lVar8 = 0x18;
  bVar11 = false;
  do {
    __n1 = *(ulong *)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].first + lVar8)
    ;
    iVar4 = 3;
    if (unit->_M_string_length < __n1) goto LAB_003b4066;
    switch(*(undefined4 *)
            ((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[10].second + lVar8)) {
    case 0:
      iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,
                      __n1,*(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                             super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                             .
                                             super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                             .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>
                                             .super__Tuple_impl<3UL,_units::modifier>.
                                             super__Head_base<3UL,_units::modifier,_false>.
                                             _M_head_impl + lVar8));
      if (iVar4 == 0) {
        iVar4 = 1;
        if (unit->_M_string_length == __n1) {
          iVar3 = 0;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,__n1);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                 *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second +
                           lVar8));
          iVar3 = 1;
        }
        goto LAB_003b4066;
      }
      break;
    case 1:
      iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,
                      __n1,*(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                             super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                             .
                                             super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                             .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>
                                             .super__Tuple_impl<3UL,_units::modifier>.
                                             super__Head_base<3UL,_units::modifier,_false>.
                                             _M_head_impl + lVar8));
      if (iVar4 == 0) {
        pcVar6 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second +
                           lVar8);
        sVar7 = strlen(pcVar6);
        __pos = 0;
LAB_003b3fc4:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,__pos,__n1
                ,pcVar6,sVar7);
        iVar3 = 1;
        iVar4 = 1;
        goto LAB_003b4066;
      }
      break;
    case 2:
      pcVar6 = *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                 .
                                 super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                 .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                 super__Tuple_impl<3UL,_units::modifier>.
                                 super__Head_base<3UL,_units::modifier,_false>._M_head_impl + lVar8)
      ;
      sVar5 = strlen(pcVar6);
      sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,pcVar6,
                   0,sVar5);
      if (sVar7 != 0xffffffffffffffff) {
        if (sVar7 == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,0,__n1);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,'*');
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,sVar7,
                  __n1,"*",1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                   *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second
                             + lVar8));
        iVar3 = 1;
      }
      iVar4 = 1;
      goto LAB_003b4056;
    case 3:
      pcVar6 = *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                 .
                                 super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                 .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                 super__Tuple_impl<3UL,_units::modifier>.
                                 super__Head_base<3UL,_units::modifier,_false>._M_head_impl + lVar8)
      ;
      sVar5 = strlen(pcVar6);
      sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,pcVar6,
                   0,sVar5);
      if (sVar7 == 0xffffffffffffffff) {
        iVar4 = 4;
      }
      else {
        iVar4 = 1;
        if (unit->_M_string_length == __n1) {
          iVar3 = 0;
        }
        else {
          pcVar6 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second
                             + lVar8);
          sVar5 = strlen(pcVar6);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,sVar7,
                  __n1,pcVar6,sVar5);
          iVar3 = 1;
        }
      }
LAB_003b4056:
      if (sVar7 == 0xffffffffffffffff) break;
      goto LAB_003b4066;
    case 4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                   super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                   .
                                   super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                   .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                   super__Tuple_impl<3UL,_units::modifier>.
                                   super__Head_base<3UL,_units::modifier,_false>._M_head_impl +
                           lVar8),&local_51);
      sVar7 = unit->_M_string_length - local_50._M_string_length;
      if (unit->_M_string_length < local_50._M_string_length || sVar7 == 0) {
        bVar10 = false;
      }
      else {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(unit,sVar7,local_50._M_string_length,&local_50);
        bVar10 = iVar4 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) {
        __pos = unit->_M_string_length - __n1;
        pcVar6 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second +
                           lVar8);
        sVar7 = strlen(pcVar6);
        goto LAB_003b3fc4;
      }
    }
    iVar4 = 0;
LAB_003b4066:
    if ((iVar4 != 3) && (iVar4 != 0)) break;
    lVar8 = lVar8 + 0x20;
    bVar11 = lVar8 == 0x4f8;
  } while (!bVar11);
  bVar9 = (byte)iVar3;
  if (!bVar11) goto LAB_003b4109;
  pcVar1 = (unit->_M_dataplus)._M_p;
  sVar2 = unit->_M_string_length;
  if ((byte)(pcVar1[sVar2 - 1] - 0x30U) < 10) {
    if (pcVar1[sVar2 - 2] == '-') {
      lVar8 = sVar2 - 2;
    }
    else {
      if ((byte)(pcVar1[sVar2 - 2] - 0x30U) < 10) goto LAB_003b40e3;
      lVar8 = sVar2 - 1;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                   (long)(pcVar1 + lVar8) - (long)pcVar1,0,1,'^');
    bVar9 = 1;
  }
  else {
LAB_003b40e3:
    bVar9 = 0;
  }
LAB_003b4109:
  return (bool)(bVar9 & 1);
}

Assistant:

static bool wordModifiers(std::string& unit)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<modSeq, 39> modifiers{{
        modSeq{"reciprocalsquare", "^-2", 16, modifier::start_tail},
        modSeq{"reciprocalcubic", "^-3", 15, modifier::start_tail},
        modSeq{"squaremeter", "m^2", 11, modifier::anywhere_tail},
        modSeq{"cubicmeter", "m^3", 10, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::tail_replace},
        modSeq{"square", "^2", 6, modifier::start_tail},
        modSeq{"squared", "^2", 7, modifier::start_tail},
        modSeq{"cubed", "^2", 7, modifier::start_tail},
        modSeq{"cu", "^3", 2, modifier::start_tail},
        modSeq{"sq", "^2", 2, modifier::start_tail},
        modSeq{"tenthousand", "10000", 11, modifier::anywhere_replace},
        modSeq{"tenths", "0.1", 5, modifier::anywhere_replace},
        modSeq{"tenth", "0.1", 5, modifier::anywhere_replace},
        modSeq{"ten", "10", 3, modifier::anywhere_replace},
        modSeq{"one", "", 3, modifier::start_replace},
        modSeq{"quarter", "0.25", 7, modifier::anywhere_replace},
        modSeq{"eighth", "0.125", 6, modifier::anywhere_replace},
        modSeq{"sixteenth", "0.0625", 9, modifier::anywhere_replace},
        modSeq{"thirtyseconds", "0.03125", 13, modifier::anywhere_replace},
        modSeq{"sixtyfourths", "0.015625", 12, modifier::anywhere_replace},
        modSeq{"half", "0.5", 4, modifier::anywhere_replace},
        modSeq{"hundred", "100", 7, modifier::anywhere_replace},
        modSeq{"million", "1e6", 7, modifier::anywhere_replace},
        modSeq{"billion", "1e9", 7, modifier::anywhere_replace},
        modSeq{"trillion", "1e12", 8, modifier::anywhere_replace},
        modSeq{"thousand", "1000", 8, modifier::anywhere_replace},
        modSeq{"tothethirdpower", "^3", 15, modifier::anywhere_replace},
        modSeq{"tothefourthpower", "^4", 16, modifier::anywhere_replace},
        modSeq{"tothefifthpower", "^5", 15, modifier::anywhere_replace},
        modSeq{"tothesixthpower", "^6", 15, modifier::anywhere_replace},
        modSeq{"squared", "^2", 7, modifier::anywhere_replace},
        modSeq{"cubed", "^3", 5, modifier::anywhere_replace},
        modSeq{"square", "^2", 6, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::anywhere_tail},
        modSeq{"sq", "^2", 2, modifier::tail_replace},
        modSeq{"cu", "^3", 2, modifier::tail_replace},
        modSeq{"u", "unit", 1, modifier::tail_replace},
    }};
    if (unit.compare(0, 3, "cup") ==
        0) {  // this causes too many issues so skip it
        return false;
    }
    if (unit.compare(0, 13, "hundredweight") ==
        0) {  // this is a specific unit and should not be cut off
        return false;
    }
    for (const auto& mod : modifiers) {
        if (unit.size() < std::get<2>(mod)) {
            continue;
        }
        switch (std::get<3>(mod)) {
            case modifier::tail_replace: {
                if (ends_with(unit, std::get<0>(mod))) {
                    unit.replace(
                        unit.size() - std::get<2>(mod),
                        std::get<2>(mod),
                        std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::anywhere_replace: {
                auto fnd = unit.find(std::get<0>(mod));
                if (fnd != std::string::npos) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.replace(fnd, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::start_tail: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.erase(0, std::get<2>(mod));
                    unit.append(std::get<1>(mod));
                    return true;
                }
                break;
                case modifier::anywhere_tail: {
                    auto fnd = unit.find(std::get<0>(mod));
                    if (fnd != std::string::npos) {
                        // this will need to be added in again if more string
                        // are added to the search list with this type if
                        // (unit.size() == std::get<2>(mod))
                        //{
                        //    return false;
                        //}
                        if (fnd != 0) {
                            unit.replace(fnd, std::get<2>(mod), "*");
                        } else {
                            unit.erase(0, std::get<2>(mod));
                            unit.push_back('*');
                        }
                        unit.append(std::get<1>(mod));
                        return true;
                    }
                }
            } break;
            case modifier::start_replace: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    unit.replace(0, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
            } break;
        }
    }

    // deal with strings if the end is a number that didn't have a ^
    if (isDigitCharacter(unit.back())) {
        if (unit[unit.size() - 2] == '-') {
            unit.insert(unit.end() - 2, '^');
            return true;
        }
        if (!isDigitCharacter(unit[unit.size() - 2])) {
            unit.insert(unit.end() - 1, '^');
            return true;
        }
    }

    return false;
}